

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_sct_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  ssl_session_st *psVar1;
  bool bVar2;
  uint16_t uVar3;
  CRYPTO_BUFFER *__p;
  uint8_t uVar4;
  
  if (contents == (CBS *)0x0) {
    return true;
  }
  ssl = hs->ssl;
  uVar3 = ssl_protocol_version(ssl);
  uVar4 = '2';
  if (uVar3 < 0x304) {
    if ((hs->config->field_0x10d & 2) == 0) {
      __assert_fail("hs->config->signed_cert_timestamps_enabled",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x4ff,"bool bssl::ext_sct_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    bVar2 = ssl_is_sct_list_valid(contents);
    if (bVar2) {
      if ((ssl->s3->field_0xdc & 0x20) != 0) {
        return true;
      }
      psVar1 = (hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      __p = CRYPTO_BUFFER_new_from_CBS
                      (contents,((ssl->ctx)._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool);
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &psVar1->signed_cert_timestamp_list,__p);
      if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
          *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
           &(((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
            signed_cert_timestamp_list)._M_t.
            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
          (crypto_buffer_st *)0x0) {
        return true;
      }
      uVar4 = 'P';
    }
  }
  *out_alert = uVar4;
  return false;
}

Assistant:

static bool ext_sct_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // TLS 1.3 SCTs are included in the Certificate extensions.
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // If this is false then we should never have sent the SCT extension in the
  // ClientHello and thus this function should never have been called.
  assert(hs->config->signed_cert_timestamps_enabled);

  if (!ssl_is_sct_list_valid(contents)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // Session resumption uses the original session information. The extension
  // should not be sent on resumption, but RFC 6962 did not make it a
  // requirement, so tolerate this.
  //
  // TODO(davidben): Enforce this anyway.
  if (!ssl->s3->session_reused) {
    hs->new_session->signed_cert_timestamp_list.reset(
        CRYPTO_BUFFER_new_from_CBS(contents, ssl->ctx->pool));
    if (hs->new_session->signed_cert_timestamp_list == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  return true;
}